

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprintconv.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **param_1_local;
  int param_0_local;
  
  local_18 = param_2;
  param_1_local._4_4_ = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  initstreams((string *)local_38,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  doit();
  return 0;
}

Assistant:

int main(int, char**) {
    initstreams();
    doit();    
}